

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::writeWithFds
          (BlockedRead *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  size_t *psVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ArrayPtr<const_unsigned_char> *pAVar7;
  uchar *puVar8;
  BlockedRead *this_00;
  long lVar9;
  undefined8 uVar10;
  size_t in_R9;
  ulong uVar11;
  bool bVar12;
  ArrayPtr<const_unsigned_char> data_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_00;
  ArrayPtr<const_unsigned_char> data_01;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_01;
  DebugExpression<bool> _kjCondition;
  Fault f;
  OwnFd local_a4;
  Fault local_a0;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  local_98;
  uchar *local_70;
  ArrayPtr<const_unsigned_char> *local_68;
  ArrayPtr<const_unsigned_char> *local_60;
  size_t local_58;
  BlockedRead *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  size_t extraout_RDX;
  
  uVar10 = moreData.size_;
  pAVar7 = moreData.ptr;
  puVar8 = (uchar *)data.size_;
  this_00 = (BlockedRead *)data.ptr;
  bVar12 = (this_00->canceler).list.ptr == (AdapterBase *)0x0;
  local_a0.exception._0_1_ = bVar12;
  if (!bVar12) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              ((Fault *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3f0,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)&local_a0,(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal((Fault *)&local_98);
  }
  uVar2 = (this_00->capBuffer).tag;
  if (uVar2 == 2) {
    if ((*(long *)((long)&(this_00->capBuffer).field_1 + 8) != 0) && (fds.size_ != 0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[130]>
                ((Fault *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x404,FAILED,(char *)0x0,
                 "\"async pipe message was written with FDs attached, but corresponding read \" \"asked for streams, and we don\'t know how to convert here\""
                 ,(char (*) [130])
                  "async pipe message was written with FDs attached, but corresponding read asked for streams, and we don\'t know how to convert here"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_98);
    }
    goto LAB_00469888;
  }
  if (uVar2 != 1) goto LAB_00469888;
  uVar11 = *(ulong *)((long)&(this_00->capBuffer).field_1 + 8);
  if (fds.size_ < uVar11) {
    fds.size_ = uVar11;
  }
  local_58 = in_R9;
  if (fds.size_ == 0) {
    lVar9 = *(long *)&(this_00->capBuffer).field_1;
LAB_0046986c:
    (this_00->capBuffer).tag = 0;
  }
  else {
    uVar11 = 0;
    local_70 = puVar8;
    local_68 = pAVar7;
    local_60 = (ArrayPtr<const_unsigned_char> *)uVar10;
    local_50 = this;
LAB_0046977c:
    do {
      iVar3 = dup(fds.ptr[uVar11]);
      if (iVar3 < 0) {
        iVar4 = kj::_::Debug::getOsErrorNumber(false);
        if (iVar4 == -1) goto LAB_0046977c;
        if (iVar4 != 0) {
          local_a0.exception = (Exception *)0x0;
          local_98.tag = 0;
          local_98._4_4_ = 0;
          local_98.field_1._0_8_ = 0;
          kj::_::Debug::Fault::init
                    (&local_a0,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_a0);
        }
      }
      lVar9 = *(long *)&(this_00->capBuffer).field_1;
      local_98.tag = *(uint *)(lVar9 + uVar11 * 4);
      *(undefined4 *)(lVar9 + uVar11 * 4) = 0xffffffff;
      *(int *)(lVar9 + uVar11 * 4) = iVar3;
      local_a4.fd = -1;
      OwnFd::~OwnFd((OwnFd *)&local_98);
      OwnFd::~OwnFd(&local_a4);
      uVar11 = uVar11 + 1;
    } while (uVar11 != fds.size_);
    lVar9 = fds.size_ * 4 + *(long *)&(this_00->capBuffer).field_1;
    uVar11 = *(long *)((long)&(this_00->capBuffer).field_1 + 8) - fds.size_;
    pAVar7 = local_68;
    puVar8 = local_70;
    this = local_50;
    uVar10 = local_60;
    if ((this_00->capBuffer).tag - 1 < 2) goto LAB_0046986c;
  }
  (this_00->capBuffer).tag = 1;
  *(long *)&(this_00->capBuffer).field_1 = lVar9;
  *(ulong *)((long)&(this_00->capBuffer).field_1 + 8) = uVar11;
  psVar1 = &(this_00->readSoFar).capCount;
  *psVar1 = *psVar1 + fds.size_;
  in_R9 = local_58;
LAB_00469888:
  data_01.size_ = (size_t)pAVar7;
  data_01.ptr = puVar8;
  moreData_01.size_ = in_R9;
  moreData_01.ptr = (ArrayPtr<const_unsigned_char> *)uVar10;
  writeImpl(&local_98,this_00,data_01,moreData_01);
  if (local_98.tag == 2) {
    uVar10 = local_98.field_1._16_8_;
    uVar5 = 1;
  }
  else {
    uVar6 = local_98.tag - 1;
    local_98.field_1._8_8_ = ZEXT48(uVar6);
    local_98.field_1._0_8_ = extraout_RDX;
    uVar5 = 0;
    if (1 < uVar6) {
      uVar5 = uVar6;
    }
  }
  if (uVar5 == 1) {
    local_48 = 0;
    uStack_40 = 0;
    data_00.size_ = local_98.field_1._0_8_;
    data_00.ptr = (uchar *)this_00->pipe;
    moreData_00.size_ = uVar10;
    moreData_00.ptr = (ArrayPtr<const_unsigned_char> *)local_98.field_1._8_8_;
    AsyncPipe::writeWithFds((AsyncPipe *)this,data_00,moreData_00,(ArrayPtr<const_int>)ZEXT816(0));
  }
  else {
    if (uVar5 != 0) {
      kj::_::unreachable();
    }
    kj::_::readyNow();
  }
  return (Promise<void>)(PromiseNode *)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}